

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULibCal.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  RTIMUSettings *this;
  RTIMUMagCal *this_00;
  RTIMUAccelCal *this_01;
  undefined1 local_6c [8];
  termios ctty;
  bool mustExit;
  char *local_20;
  char *settingsFile;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    local_20 = argv[1];
  }
  else {
    local_20 = "RTIMULib";
  }
  printf("RTIMULibCal - using %s.ini\n",local_20);
  this = (RTIMUSettings *)operator_new(0x2b0);
  RTIMUSettings::RTIMUSettings(this,local_20);
  ctty.c_ispeed._3_1_ = 0;
  imu = (RTIMU *)0x0;
  settings = this;
  newIMU();
  RTIMU::setCompassCalibrationMode(imu,true);
  RTIMU::setAccelCalibrationMode(imu,true);
  this_00 = (RTIMUMagCal *)operator_new(0x3a9f0);
  RTIMUMagCal::RTIMUMagCal(this_00,settings);
  magCal = this_00;
  RTIMUMagCal::magCalInit();
  magMinMaxDone = false;
  this_01 = (RTIMUAccelCal *)operator_new(0x40);
  RTIMUAccelCal::RTIMUAccelCal(this_01,settings);
  accelCal = this_01;
  RTIMUAccelCal::accelCalInit();
  iVar1 = fileno(_stdout);
  tcgetattr(iVar1,(termios *)local_6c);
  ctty.c_oflag = ctty.c_oflag & 0xfffffffd;
  iVar1 = fileno(_stdout);
  tcsetattr(iVar1,0,(termios *)local_6c);
  while (((ctty.c_ispeed._3_1_ ^ 0xff) & 1) != 0) {
    displayMenu();
    iVar1 = getchar();
    iVar1 = tolower(iVar1);
    switch(iVar1) {
    case 0x61:
      doAccelCal();
      break;
    case 0x65:
      doMagEllipsoidCal();
      break;
    case 0x6d:
      doMagMinMaxCal();
      break;
    case 0x78:
      ctty.c_ispeed._3_1_ = 1;
    }
  }
  printf("\nRTIMULibCal exiting\n");
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    char *settingsFile;

    if (argc == 2)
        settingsFile = argv[1];
    else
        settingsFile = (char *)"RTIMULib";

    printf("RTIMULibCal - using %s.ini\n", settingsFile);

    settings = new RTIMUSettings(settingsFile);

    bool mustExit = false;
    imu = NULL;
    newIMU();

    //  set up for calibration run

    imu->setCompassCalibrationMode(true);
    imu->setAccelCalibrationMode(true);
    magCal = new RTIMUMagCal(settings);
    magCal->magCalInit();
    magMinMaxDone = false;
    accelCal = new RTIMUAccelCal(settings);
    accelCal->accelCalInit();

    //  set up console io

    struct termios	ctty;

    tcgetattr(fileno(stdout), &ctty);
    ctty.c_lflag &= ~(ICANON);
    tcsetattr(fileno(stdout), TCSANOW, &ctty);

    //  the main loop

    while (!mustExit) {
        displayMenu();
        switch (tolower(getchar())) {
        case 'x' :
            mustExit = true;
            break;

        case 'm' :
            doMagMinMaxCal();
            break;

        case 'e' :
            doMagEllipsoidCal();
            break;

        case 'a' :
            doAccelCal();
            break;
        }
    }

    printf("\nRTIMULibCal exiting\n");
    return 0;
}